

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O1

shared_ptr<mcc::DeclList> __thiscall mcc::Parser::DeclarationList(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  int iVar1;
  bool bVar2;
  int iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TokenType type_00;
  Parser *in_RSI;
  shared_ptr<mcc::DeclList> sVar4;
  bool local_f3;
  bool local_f2;
  bool local_f1;
  shared_ptr<mcc::Expr> init;
  undefined1 local_e0 [16];
  shared_ptr<mcc::Token> len;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  shared_ptr<mcc::Token> token;
  vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
  var_decl_list;
  Type type;
  shared_ptr<mcc::Token> name;
  element_type *local_48;
  element_type *local_38;
  
  var_decl_list.
  super__Vector_base<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  var_decl_list.
  super__Vector_base<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  var_decl_list.
  super__Vector_base<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (in_RSI->token_).super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (in_RSI->token_).super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  ParsePrim(&type,in_RSI);
  iVar1 = 0;
  do {
    do {
      iVar3 = iVar1;
      bVar2 = Match(in_RSI,T_STAR);
      iVar1 = iVar3 + 1;
    } while (bVar2);
    init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_e0
    ;
    type.ind = iVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&init,"Expected identifier after type declaration","");
    type_00 = (TokenType)in_RSI;
    Consume((Parser *)&name,type_00,(string *)0x30);
    if (init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_e0) {
      operator_delete(init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (ulong)((long)&(((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                        *)local_e0._0_8_)->
                                     super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1));
    }
    bVar2 = Match(in_RSI,T_LBRACKET);
    if (bVar2) {
      init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init,"Expected integer length > 0","");
      Consume((Parser *)&len,type_00,(string *)0x2e);
      if (init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_e0) {
        operator_delete(init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        (ulong)((long)&(((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                          *)local_e0._0_8_)->
                                       super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init,"Expected \']\' after array length declaration","");
      Consume((Parser *)&stack0xffffffffffffffc0,type_00,(string *)0xc);
      if (local_38 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      }
      if (init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_e0) {
        operator_delete(init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        (ulong)((long)&(((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                          *)local_e0._0_8_)->
                                       super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      type.len = (len.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->int_value_
      ;
      local_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_f3 = false;
      local_f1 = true;
      init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mcc::VarDecl,std::allocator<mcc::VarDecl>,std::shared_ptr<mcc::Token>&,decltype(nullptr),mcc::Type&,bool,bool>
                (&init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (VarDecl **)&init,(allocator<mcc::VarDecl> *)&local_f2,&name,&local_c0._M_pi,&type,
                 &local_f3,&local_f1);
      std::__shared_ptr<mcc::VarDecl,(__gnu_cxx::_Lock_policy)2>::
      _M_enable_shared_from_this_with<mcc::VarDecl,mcc::VarDecl>
                ((__shared_ptr<mcc::VarDecl,(__gnu_cxx::_Lock_policy)2> *)&init,
                 (VarDecl *)init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>::
      emplace_back<std::shared_ptr<mcc::VarDecl>>
                ((vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>
                  *)&var_decl_list,(shared_ptr<mcc::VarDecl> *)&init);
      if (init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      type.len = 0;
      this_00._M_pi =
           len.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
    else {
      OptionalExpression((Parser *)&init,type_00);
      local_f2 = false;
      local_f3 = true;
      len.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mcc::VarDecl,std::allocator<mcc::VarDecl>,std::shared_ptr<mcc::Token>&,std::shared_ptr<mcc::Expr>&,mcc::Type&,bool,bool>
                (&len.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (VarDecl **)&len,(allocator<mcc::VarDecl> *)&local_c0,&name,&init,&type,&local_f2,
                 &local_f3);
      std::__shared_ptr<mcc::VarDecl,(__gnu_cxx::_Lock_policy)2>::
      _M_enable_shared_from_this_with<mcc::VarDecl,mcc::VarDecl>
                ((__shared_ptr<mcc::VarDecl,(__gnu_cxx::_Lock_policy)2> *)&len,
                 (VarDecl *)len.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>::
      emplace_back<std::shared_ptr<mcc::VarDecl>>
                ((vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>
                  *)&var_decl_list,(shared_ptr<mcc::VarDecl> *)&len);
      this_00 = init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      if (len.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (len.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
        this_00 = init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      }
    }
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    if (name.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (name.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    bVar2 = Match(in_RSI,T_COMMA);
    iVar1 = 0;
  } while (bVar2);
  init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&init,"Expected \';\' after variable declaration","");
  Consume((Parser *)&stack0xffffffffffffffb0,type_00,(string *)0x6);
  if (local_48 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  if (init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_e0) {
    operator_delete(init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)((long)&(((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                      *)local_e0._0_8_)->
                                   super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1));
  }
  this->scanner_ = (Scanner *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mcc::DeclList,std::allocator<mcc::DeclList>,std::shared_ptr<mcc::Token>,std::vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->reporter_,(DeclList **)this,
             (allocator<mcc::DeclList> *)&init,&token,&var_decl_list);
  std::__shared_ptr<mcc::DeclList,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<mcc::DeclList,mcc::DeclList>
            ((__shared_ptr<mcc::DeclList,(__gnu_cxx::_Lock_policy)2> *)this,
             (DeclList *)this->scanner_);
  if (type.name.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (type.name.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>::
  ~vector(&var_decl_list);
  sVar4.super___shared_ptr<mcc::DeclList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<mcc::DeclList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<mcc::DeclList>)
         sVar4.super___shared_ptr<mcc::DeclList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<DeclList> Parser::DeclarationList() {
  std::vector<std::shared_ptr<VarDecl>> var_decl_list;
  std::shared_ptr<Token> token = Peek();
  Type type = ParsePrim();

  do {
    ParsePtr(type);
    std::shared_ptr<Token> name = Consume(TokenType::T_IDENTIFIER,"Expected identifier after type declaration");
    if (Match(TokenType::T_LBRACKET)) {
      std::shared_ptr<Token> len = Consume(TokenType::T_INT_LIT, "Expected integer length > 0");
      Consume(TokenType::T_RBRACKET, "Expected ']' after array length declaration");
      type.len = len->Int();
      var_decl_list.push_back(std::make_shared<VarDecl>(name, nullptr, type, false, true));
      type.len = 0;
    } else {
      std::shared_ptr<Expr> init = OptionalExpression(0);
      var_decl_list.push_back(std::make_shared<VarDecl>(name, init, type, false, true));
    }
  } while (Match(TokenType::T_COMMA));

  Consume(TokenType::T_SEMICOLON, "Expected ';' after variable declaration");
  return std::make_shared<DeclList>(std::move(token), var_decl_list);
}